

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O0

HelicsConfigJSON * helics::addJsonConfig(App *app)

{
  element_type *peVar1;
  Option *pOVar2;
  Option *this;
  Option *__a;
  App *in_RDI;
  element_type *fmtrRet;
  shared_ptr<helics::HelicsConfigJSON> fmtr;
  string *in_stack_fffffffffffffdf8;
  App *in_stack_fffffffffffffe00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffe08;
  Option *in_stack_fffffffffffffe10;
  allocator<char> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  allocator<char> local_149 [40];
  allocator<char> local_121 [41];
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  App *in_stack_ffffffffffffff20;
  allocator<char> local_c9 [40];
  allocator<char> local_a1 [40];
  allocator<char> local_79 [40];
  allocator<char> local_51 [49];
  element_type *local_20;
  __shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2> local_18;
  App *local_8;
  
  local_8 = in_RDI;
  CLI::std::make_shared<helics::HelicsConfigJSON>();
  local_20 = CLI::std::__shared_ptr<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2>::get
                       (&local_18);
  CLI::App::allow_config_extras(local_8,ignore_all);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  peVar1 = CLI::std::
           __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x599f1d);
  CLI::ConfigBase::sectionRef_abi_cxx11_(&peVar1->super_ConfigBase);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff08);
  pOVar2 = CLI::OptionBase<CLI::Option>::configurable(&pOVar2->super_OptionBase<CLI::Option>,false);
  CLI::Option::trigger_on_parse(pOVar2,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_79);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  peVar1 = CLI::std::
           __shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::HelicsConfigJSON,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x59a02d);
  CLI::ConfigBase::indexRef(&peVar1->super_ConfigBase);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  pOVar2 = CLI::App::add_option<short,_short,_(CLI::detail::enabler)0>
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                      (short *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this = CLI::OptionBase<CLI::Option>::configurable(&pOVar2->super_OptionBase<CLI::Option>,false);
  CLI::Option::trigger_on_parse(this,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_c9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_a1);
  __a = CLI::App::get_config_ptr(local_8);
  CLI::std::shared_ptr<helics::HelicsConfigJSON>::shared_ptr
            ((shared_ptr<helics::HelicsConfigJSON> *)in_stack_fffffffffffffe00,
             (shared_ptr<helics::HelicsConfigJSON> *)in_stack_fffffffffffffdf8);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<helics::addJsonConfig(CLI::App*)::__0,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffe10,(anon_class_16_1_898bb283 *)in_stack_fffffffffffffe08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2,
             (char *)this,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pOVar2,
             (char *)this,(allocator<char> *)__a);
  CLI::Option::check(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (string *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_149);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  std::allocator<char>::~allocator(local_121);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x59a1e8);
  addJsonConfig(CLI::App*)::$_0::~__0((anon_class_16_1_898bb283 *)0x59a1f5);
  std::shared_ptr<CLI::Config>::shared_ptr<helics::HelicsConfigJSON,void>
            ((shared_ptr<CLI::Config> *)in_stack_fffffffffffffe00,
             (shared_ptr<helics::HelicsConfigJSON> *)in_stack_fffffffffffffdf8);
  CLI::App::config_formatter
            (in_stack_fffffffffffffe00,(shared_ptr<CLI::Config> *)in_stack_fffffffffffffdf8);
  CLI::std::shared_ptr<CLI::Config>::~shared_ptr((shared_ptr<CLI::Config> *)0x59a23a);
  CLI::std::shared_ptr<helics::HelicsConfigJSON>::~shared_ptr
            ((shared_ptr<helics::HelicsConfigJSON> *)0x59a254);
  return local_20;
}

Assistant:

HelicsConfigJSON* addJsonConfig(CLI::App* app)
{
    auto fmtr = std::make_shared<HelicsConfigJSON>();
    auto* fmtrRet = fmtr.get();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->add_option("--config_section",
                    fmtr->sectionRef(),
                    "specify the section of the config file to use")
        ->configurable(false)
        ->trigger_on_parse();
    app->add_option("--config_index",
                    fmtr->indexRef(),
                    "specify the section index of the config file to use for configuration arrays")
        ->configurable(false)
        ->trigger_on_parse();
    app->get_config_ptr()->check([fmtr](const std::string& filename) {
        if (CLI::ExistingFile(filename).empty()) {
            fmtr->skipJson(!fileops::hasJsonExtension(filename));
        }
        return std::string{};
    });

    app->config_formatter(std::move(fmtr));
    return fmtrRet;
}